

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

void __thiscall
phmap::priv::
btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>
::clear(btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>
        *this)

{
  bool bVar1;
  node_type *pnVar2;
  node_type **ppnVar3;
  btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>
  *this_local;
  
  bVar1 = empty(this);
  if (!bVar1) {
    pnVar2 = root(this);
    internal_clear(this,pnVar2);
  }
  pnVar2 = EmptyNode();
  ppnVar3 = mutable_root(this);
  *ppnVar3 = pnVar2;
  pnVar2 = EmptyNode();
  this->rightmost_ = pnVar2;
  this->size_ = 0;
  return;
}

Assistant:

void btree<P>::clear() {
        if (!empty()) {
            internal_clear(root());
        }
        mutable_root() = EmptyNode();
        rightmost_ = EmptyNode();
        size_ = 0;
    }